

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_block.cpp
# Opt level: O0

Transaction * __thiscall
cfd::core::Block::GetTransaction(Transaction *__return_storage_ptr__,Block *this,Txid *txid)

{
  ulong uVar1;
  size_t this_00;
  bool bVar2;
  size_type sVar3;
  const_reference txid_00;
  const_reference byte_data;
  CfdException *this_01;
  allocator local_49;
  string local_48;
  ulong local_28;
  size_t index;
  Txid *txid_local;
  Block *this_local;
  
  local_28 = 0;
  index = (size_t)txid;
  txid_local = (Txid *)this;
  this_local = (Block *)__return_storage_ptr__;
  while( true ) {
    uVar1 = local_28;
    sVar3 = ::std::vector<cfd::core::Txid,_std::allocator<cfd::core::Txid>_>::size(&this->txids_);
    this_00 = index;
    if (sVar3 <= uVar1) {
      this_01 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_48,"target txid not found.",&local_49);
      CfdException::CfdException(this_01,kCfdIllegalArgumentError,&local_48);
      __cxa_throw(this_01,&CfdException::typeinfo,CfdException::~CfdException);
    }
    txid_00 = ::std::vector<cfd::core::Txid,_std::allocator<cfd::core::Txid>_>::operator[]
                        (&this->txids_,local_28);
    bVar2 = Txid::Equals((Txid *)this_00,txid_00);
    if (bVar2) break;
    local_28 = local_28 + 1;
  }
  byte_data = ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator[]
                        (&this->txs_,local_28);
  Transaction::Transaction(__return_storage_ptr__,byte_data);
  return __return_storage_ptr__;
}

Assistant:

Transaction Block::GetTransaction(const Txid& txid) const {
  for (size_t index = 0; index < txids_.size(); ++index) {
    if (txid.Equals(txids_[index])) {
      return Transaction(txs_[index]);
    }
  }
  throw CfdException(
      CfdError::kCfdIllegalArgumentError, "target txid not found.");
}